

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

int deqp::gles3::Functional::anon_unknown_0::compareImages
              (TestLog *log,ConstPixelBufferAccess *test,ConstPixelBufferAccess *ref,
              PixelBufferAccess *diffMask,int kernelRadius,_func_bool_IVec4_ptr_IVec4_ptr *pixelCmp)

{
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int kX;
  int z;
  int iVar10;
  int iVar11;
  int y;
  int kY;
  int iVar12;
  int local_234;
  int local_228;
  int local_220;
  int radius;
  IVec4 cTest;
  undefined1 local_1c0 [16];
  IVec4 cRef;
  
  iVar2 = (test->m_size).m_data[0];
  iVar3 = (test->m_size).m_data[1];
  tcu::clear(diffMask,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_OK);
  iVar7 = 0;
  if (0 < iVar2) {
    iVar7 = iVar2;
  }
  iVar8 = 0;
  if (0 < iVar3) {
    iVar8 = iVar3;
  }
  local_234 = -1;
  local_220 = 0;
  local_228 = 0;
  z = 0;
  do {
    if (z == iVar8) {
      poVar1 = (ostringstream *)(cRef.m_data + 2);
      cRef.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::operator<<(poVar1,local_220);
      std::operator<<((ostream *)poVar1," deviating pixel(s) found.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&cRef,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      poVar1 = (ostringstream *)(cRef.m_data + 2);
      cRef.m_data._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::operator<<(poVar1,local_228);
      std::operator<<((ostream *)poVar1," faulty pixel(s) found.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&cRef,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      if (local_234 != 1) {
        local_228 = local_234;
      }
      return local_228;
    }
    iVar9 = z + kernelRadius;
    for (y = 0; y != iVar7; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&cRef,(int)ref,y,z);
      tcu::ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&cTest,(int)test,y,z);
      bVar6 = (*pixelCmp)(&cRef,&cTest);
      if (!bVar6) {
        if (((kernelRadius <= y && kernelRadius <= z) && iVar9 < iVar3) &&
           (iVar11 = y + kernelRadius, iVar11 < iVar2)) {
          bVar5 = 0;
          for (iVar12 = z - kernelRadius; iVar10 = y - kernelRadius, iVar12 <= iVar9;
              iVar12 = iVar12 + 1) {
            do {
              if (iVar11 < iVar10) goto LAB_010e416e;
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_1c0,(int)test,iVar10,iVar12);
              bVar6 = (*pixelCmp)(&cRef,(IVec4 *)local_1c0);
              iVar10 = iVar10 + 1;
            } while (!bVar6);
            bVar5 = 1;
LAB_010e416e:
          }
          bVar4 = 0;
          for (iVar12 = z - kernelRadius; iVar10 = y - kernelRadius, iVar12 <= iVar9;
              iVar12 = iVar12 + 1) {
            do {
              if (iVar11 < iVar10) goto LAB_010e41bb;
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_1c0,(int)ref,iVar10,iVar12);
              bVar6 = (*pixelCmp)(&cTest,(IVec4 *)local_1c0);
              iVar10 = iVar10 + 1;
            } while (!bVar6);
            bVar4 = 1;
LAB_010e41bb:
          }
          if (!(bool)(bVar5 & bVar4)) {
            tcu::PixelBufferAccess::setPixel
                      (diffMask,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_FAIL,y,z,0);
            local_228 = local_228 + 1;
            local_234 = 1;
            goto LAB_010e4206;
          }
        }
        tcu::PixelBufferAccess::setPixel
                  (diffMask,(Vec4 *)Functional::(anonymous_namespace)::MASK_COLOR_DEV,y,z,0);
        if (local_234 == -1) {
          local_234 = 0;
        }
        local_220 = local_220 + 1;
      }
LAB_010e4206:
    }
    z = z + 1;
  } while( true );
}

Assistant:

inline int compareImages (tcu::TestLog& log, const ConstPixelBufferAccess& test, const ConstPixelBufferAccess& ref, const PixelBufferAccess& diffMask, int kernelRadius, bool (*pixelCmp)(const tcu::IVec4& a, const tcu::IVec4& b))
{
	const int			height				= test.getHeight();
	const int			width				= test.getWidth();
	int					deviatingPixels		= 0;
	int					faultyPixels		= 0;
	int					compareFailed		= -1;

	tcu::clear(diffMask, MASK_COLOR_OK);

	for (int y = 0; y < height; y++)
	{
		for (int x = 0; x < width; x++)
		{
			const tcu::IVec4 cRef	= ref.getPixelInt(x, y);
			const tcu::IVec4 cTest	= test.getPixelInt(x, y);

			// Pixelwise match, no deviation or fault
			if ((*pixelCmp)(cRef, cTest))
				continue;

			// Deviation
			{
				const int radius	= kernelRadius;
				bool foundRef		= false;
				bool foundTest		= false;

				// edges are considered a "deviation" too. The suitable pixel could be "behind" the edge
				if (y < radius || x < radius || y + radius >= height || x + radius >= width)
				{
					foundRef	= true;
					foundTest	= true;
				}
				else
				{
					// find ref
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cRef, test.getPixelInt(kX, kY)))
						{
							foundRef = true;
							break;
						}
					}

					// find result
					for (int kY = y - radius; kY <= y + radius; kY++)
					for (int kX = x - radius; kX <= x + radius; kX++)
					{
						if ((*pixelCmp)(cTest, ref.getPixelInt(kX, kY)))
						{
							foundTest = true;
							break;
						}
					}
				}

				// A pixel is deviating if the reference color is found inside the kernel and (~= every pixel reference draws must be drawn by the gl too)
				// the result color is found in the reference image inside the kernel         (~= every pixel gl draws must be drawn by the reference too)
				if (foundRef && foundTest)
				{
					diffMask.setPixel(MASK_COLOR_DEV, x, y);
					if (compareFailed == -1)
						compareFailed = 0;
					deviatingPixels++;
					continue;
				}
			}

			diffMask.setPixel(MASK_COLOR_FAIL, x, y);
			faultyPixels++;									// The pixel is faulty if the color is not found
			compareFailed = 1;
		}
	}

	log << TestLog::Message << deviatingPixels	<< " deviating pixel(s) found." << TestLog::EndMessage;
	log << TestLog::Message << faultyPixels		<< " faulty pixel(s) found." << TestLog::EndMessage;

	return (compareFailed == 1 ? faultyPixels : compareFailed);
}